

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

void __thiscall jrtplib::RTPUDPv4Transmitter::~RTPUDPv4Transmitter(RTPUDPv4Transmitter *this)

{
  RTPUDPv4Transmitter *this_local;
  
  (this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPUDPv4Transmitter_00191ee0;
  (*(this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject[4])();
  RTPAbortDescriptors::~RTPAbortDescriptors(&this->m_abortDesc);
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
  ::~RTPKeyHashTable(&this->acceptignoreinfo);
  std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::~list
            (&this->rawpacketlist);
  RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>::
  ~RTPHashTable(&this->multicastgroups);
  RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPUDPv4Trans_GetHashIndex_IPv4Dest,_8317>
  ::~RTPHashTable(&this->destinations);
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::~list(&this->localIPs);
  RTPTransmitter::~RTPTransmitter(&this->super_RTPTransmitter);
  return;
}

Assistant:

RTPUDPv4Transmitter::~RTPUDPv4Transmitter()
{
	Destroy();
}